

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_c99.c
# Opt level: O0

void test_s64(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int64_t native_result;
  int64_t libdiv_result;
  int64_t step;
  int64_t end;
  int64_t loop;
  libdivide_s64_t divider;
  int64_t denom;
  int64_t magic;
  uint64_t twice_rem;
  uint64_t e;
  uint64_t proposed_m;
  uint64_t rem;
  uint8_t more;
  uint32_t floor_log_2_d;
  uint64_t absD;
  uint64_t ud;
  libdivide_s64_t result;
  uint64_t result_1;
  int64_t q_1;
  int64_t sign_1;
  uint64_t uq_1;
  int64_t sign;
  int64_t q;
  uint64_t uq;
  uint64_t mask;
  uint8_t shift;
  __int128_t rl;
  __int128_t yl;
  __int128_t xl;
  ulong local_1b8;
  ulong local_199;
  byte local_191;
  long local_190;
  ulong local_188;
  byte local_180;
  ulong local_178;
  byte local_170;
  undefined8 local_168;
  ulong local_160;
  byte local_158;
  ulong *local_150;
  ulong local_148;
  ulong local_140;
  byte local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  long local_118;
  undefined1 local_110 [11];
  byte local_105;
  undefined4 local_104;
  undefined8 local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  ulong local_d9;
  byte local_d1;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  long local_80;
  long local_78;
  ulong local_70;
  byte local_62;
  byte local_61;
  ulong local_60;
  ulong local_58;
  long local_50;
  undefined8 local_48;
  long local_40;
  ulong local_38;
  long local_30;
  ulong local_28;
  ulong local_20;
  ulong local_10;
  ulong local_8;
  
  local_190 = -0x3fffff87;
  local_168 = 0xffffffffc0000079;
  local_e8 = 0xffffffffc0000079;
  local_ec = 0;
  local_f8 = 0xffffffffc0000079;
  local_100 = 0x3fffff87;
  local_d0 = 0x3fffff87;
  local_104 = 0x1d;
  local_c0 = local_110;
  local_118 = 0;
  uVar3 = SUB168((ZEXT816(0x10000000) << 0x40) % ZEXT816(0x3fffff87),0);
  local_120 = 0x3fffff87 - uVar3;
  if (local_120 < 0x20000000) {
    local_105 = 0x1c;
  }
  else {
    local_118 = 0;
    local_128 = uVar3 * 2;
    if ((0x3fffff86 < local_128) || (local_128 < uVar3)) {
      local_118 = 1;
    }
    local_105 = 0x5d;
  }
  local_118 = local_118 + 1;
  local_191 = local_105 | 0x80;
  local_199 = -local_118;
  local_a8 = 0x10000000;
  local_b0 = 0;
  local_b8 = 0x3fffff87;
  local_c8 = 0;
  local_1b8 = 0xffffffff800000f5;
  local_188 = local_199;
  local_180 = local_191;
  local_178 = local_199;
  local_170 = local_191;
  local_160 = local_199;
  local_158 = local_191;
  local_140 = local_199;
  local_138 = local_191;
  local_130 = local_199;
  local_105 = local_191;
  local_d9 = local_199;
  local_d1 = local_191;
  printf("Testing int64_t, %ld from %ld to %ld, step %ld\n",0xffffffffc0000079,0xffffffff800000f5,
         0xfffffe1c,0xbffff);
  for (; (long)local_1b8 < 0xfffffe1c; local_1b8 = local_1b8 + 0xbffff) {
    local_148 = local_1b8;
    local_150 = &local_199;
    local_60 = local_199;
    local_61 = local_191;
    local_58 = local_1b8;
    local_62 = local_191 & 0x3f;
    uVar3 = (long)local_1b8 >> 0x3f;
    if (local_199 == 0) {
      local_70 = (1L << local_62) - 1;
      local_78 = local_1b8 + (uVar3 & local_70);
      local_88 = (ulong)((int)(char)local_191 >> 7);
      local_80 = (local_78 >> local_62 ^ local_88) - local_88;
      local_50 = local_80;
    }
    else {
      local_8 = local_1b8;
      local_28 = local_1b8;
      local_30 = (long)local_199 >> 0x3f;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_1b8;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_199;
      local_48 = SUB168(auVar1 * auVar2,0);
      local_40 = SUB168(auVar1 * auVar2,8) + local_1b8 * local_30 + uVar3 * local_199;
      local_90 = local_40;
      if ((local_191 & 0x40) != 0) {
        local_98 = (ulong)((int)(char)local_191 >> 7);
        local_90 = ((local_1b8 ^ local_98) - local_98) + local_40;
      }
      local_a0 = (long)(int)(uint)(local_90 >> local_62 < 0) + (local_90 >> local_62);
      local_50 = local_a0;
      local_38 = local_60;
      local_20 = uVar3;
      local_10 = local_60;
    }
    if (local_50 != (long)local_1b8 / local_190) {
      fprintf(_stderr,"Division fail: int64_t, %ld/%ld. Native: %ld, Libdivide %ld\n",local_1b8,
              local_190,(long)local_1b8 / local_190,local_50);
    }
  }
  return;
}

Assistant:

void test_s64(void) {
   int64_t denom =  -(((int64_t)2 << 29) - 121); // Prime - see https://primes.utm.edu/lists/2small/0bit.html
   struct libdivide_s64_t divider = libdivide_s64_gen(denom);
#define OP_S64(numer, divider) libdivide_s64_do(numer, &divider)
   TEST_BODY(int64_t, INT64_MAX, denom, divider, PRId64, OP_S64)
}